

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O0

void duckdb_zstd::ZSTD_initFseState(ZSTD_fseState *DStatePtr,BIT_DStream_t *bitD,ZSTD_seqSymbol *dt)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  void *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  ZSTD_seqSymbol_header *DTableH;
  void *ptr;
  size_t value;
  BIT_DStream_status result;
  U32 nbBytes;
  U32 regMask;
  uint local_44;
  
  uVar2 = in_RSI[1];
  bVar1 = (byte)*(int *)((long)in_RDX + 4);
  *(int *)(in_RSI + 1) = *(int *)((long)in_RDX + 4) + (int)in_RSI[1];
  *in_RDI = *in_RSI >> (('@' - (char)(int)uVar2) - bVar1 & 0x3f) & (1L << (bVar1 & 0x3f)) - 1U;
  if ((uint)in_RSI[1] < 0x41) {
    if (in_RSI[2] < in_RSI[4]) {
      if (in_RSI[2] != in_RSI[3]) {
        local_44 = (uint)in_RSI[1] >> 3;
        if (in_RSI[2] - (ulong)local_44 < in_RSI[3]) {
          local_44 = (int)in_RSI[2] - (int)in_RSI[3];
        }
        in_RSI[2] = in_RSI[2] - (ulong)local_44;
        *(uint *)(in_RSI + 1) = (int)in_RSI[1] + local_44 * -8;
        sVar3 = MEM_readLEST(in_RDX);
        *in_RSI = sVar3;
      }
    }
    else {
      BIT_reloadDStream_internal((BIT_DStream_t *)0xa1ca21);
    }
  }
  else {
    in_RSI[2] = (ulong)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
  in_RDI[1] = (long)in_RDX + 8;
  return;
}

Assistant:

static void
ZSTD_initFseState(ZSTD_fseState* DStatePtr, BIT_DStream_t* bitD, const ZSTD_seqSymbol* dt)
{
    const void* ptr = dt;
    const ZSTD_seqSymbol_header* const DTableH = (const ZSTD_seqSymbol_header*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    DEBUGLOG(6, "ZSTD_initFseState : val=%u using %u bits",
                (U32)DStatePtr->state, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}